

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O2

string * __thiscall
cmsys::SystemInformationImplementation::ExtractValueFromCpuInfoFile
          (string *__return_storage_ptr__,SystemInformationImplementation *this,string *buffer,
          char *word,size_t init)

{
  char cVar1;
  size_t sVar2;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  allocator local_59;
  size_t local_58;
  string local_50;
  
  sVar2 = std::__cxx11::string::find((char *)buffer,(ulong)word);
  if (sVar2 != 0xffffffffffffffff) {
    this->CurrentPositionInFile = sVar2;
    uVar3 = std::__cxx11::string::find((char *)buffer,0x53cc9c);
    sVar2 = std::__cxx11::string::find((char *)buffer,0x55d139);
    if (sVar2 != 0xffffffffffffffff && uVar3 != 0xffffffffffffffff) {
      local_58 = this->CurrentPositionInFile;
      sVar4 = strlen(word);
      uVar5 = sVar4 + local_58;
      while( true ) {
        if (uVar3 <= uVar5) {
          std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)buffer);
          return __return_storage_ptr__;
        }
        cVar1 = (buffer->_M_dataplus)._M_p[uVar5];
        if ((cVar1 != '\t') && (cVar1 != ' ')) break;
        uVar5 = uVar5 + 1;
      }
      std::__cxx11::string::string((string *)&local_50,(string *)buffer);
      ExtractValueFromCpuInfoFile(__return_storage_ptr__,this,&local_50,word,sVar2);
      std::__cxx11::string::~string((string *)&local_50);
      return __return_storage_ptr__;
    }
  }
  this->CurrentPositionInFile = 0xffffffffffffffff;
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_59);
  return __return_storage_ptr__;
}

Assistant:

std::string SystemInformationImplementation::ExtractValueFromCpuInfoFile(
  std::string buffer, const char* word, size_t init)
{
  size_t pos = buffer.find(word, init);
  if (pos != std::string::npos) {
    this->CurrentPositionInFile = pos;
    pos = buffer.find(":", pos);
    size_t pos2 = buffer.find("\n", pos);
    if (pos != std::string::npos && pos2 != std::string::npos) {
      // It may happen that the beginning matches, but this is still not the
      // requested key.
      // An example is looking for "cpu" when "cpu family" comes first. So we
      // check that
      // we have only spaces from here to pos, otherwise we search again.
      for (size_t i = this->CurrentPositionInFile + strlen(word); i < pos;
           ++i) {
        if (buffer[i] != ' ' && buffer[i] != '\t') {
          return this->ExtractValueFromCpuInfoFile(buffer, word, pos2);
        }
      }
      return buffer.substr(pos + 2, pos2 - pos - 2);
    }
  }
  this->CurrentPositionInFile = std::string::npos;
  return "";
}